

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_request_completion
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  u_char *puVar1;
  
  puVar1 = "OK";
  if ((*(ulong *)&r->field_0x468 & 0x40000) == 0) {
    puVar1 = "";
  }
  *(uint *)v = (((uint)*(ulong *)&r->field_0x468 & 0x40000) >> 0x11) + (*(uint *)v & 0x80000000) +
               0x10000000;
  v->data = puVar1;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_request_completion(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    if (r->request_complete) {
        v->len = 2;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = (u_char *) "OK";

        return NGX_OK;
    }

    v->len = 0;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = (u_char *) "";

    return NGX_OK;
}